

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

void __thiscall chaiscript::ChaiScript_Basic::~ChaiScript_Basic(ChaiScript_Basic *this)

{
  ChaiScript_Parser_Base *pCVar1;
  
  this->_vptr_ChaiScript_Basic = (_func_int **)&PTR__ChaiScript_Basic_00237458;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<chaiscript::dispatch::Dynamic_Object_&()>_>_>_>
  ::~_Rb_tree(&(this->m_namespace_generators)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>,_chaiscript::str_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~_Rb_tree(&(this->m_engine).m_state.m_types._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_chaiscript::str_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&(this->m_engine).m_state.m_global_objects._M_t);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~vector(&(this->m_engine).m_state.m_boxed_functions.data);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  ::~vector(&(this->m_engine).m_state.m_function_objects.data);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>
  ::~vector(&(this->m_engine).m_state.m_functions.data);
  detail::threading::Thread_Storage<chaiscript::detail::Stack_Holder>::~Thread_Storage
            (&(this->m_engine).m_stack_holder);
  detail::threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::~Thread_Storage
            (&(this->m_engine).m_conversions.m_conversion_saves);
  detail::threading::
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  ::~Thread_Storage(&(this->m_engine).m_conversions.m_thread_cache);
  std::
  _Rb_tree<const_std::type_info_*,_const_std::type_info_*,_std::_Identity<const_std::type_info_*>,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  ::~_Rb_tree(&(this->m_engine).m_conversions.m_convertableTypes._M_t);
  std::
  _Rb_tree<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::_Identity<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  ::~_Rb_tree(&(this->m_engine).m_conversions.m_conversions._M_t);
  pCVar1 = (this->m_parser)._M_t.
           super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
           ._M_t.
           super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
           .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl;
  if (pCVar1 != (ChaiScript_Parser_Base *)0x0) {
    (*pCVar1->_vptr_ChaiScript_Parser_Base[4])();
  }
  (this->m_parser)._M_t.
  super___uniq_ptr_impl<chaiscript::parser::ChaiScript_Parser_Base,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_std::default_delete<chaiscript::parser::ChaiScript_Parser_Base>_>
  .super__Head_base<0UL,_chaiscript::parser::ChaiScript_Parser_Base_*,_false>._M_head_impl =
       (ChaiScript_Parser_Base *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_use_paths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_module_paths);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->m_active_loaded_modules)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
  ::~_Rb_tree(&(this->m_loaded_modules)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->m_used_files)._M_t);
  return;
}

Assistant:

virtual ~ChaiScript_Basic() = default;